

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

vector<const_char_*,_std::allocator<const_char_*>_> * __thiscall
spvtools::Optimizer::GetPassNames
          (vector<const_char_*,_std::allocator<const_char_*>_> *__return_storage_ptr__,
          Optimizer *this)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  _Head_base<0UL,_spvtools::Optimizer::Impl_*,_false> _Var4;
  ulong uVar5;
  char *local_40;
  spv_position_t local_38;
  
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var4._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
  puVar2 = *(pointer *)
            &((vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
               *)((long)&(_Var4._M_head_impl)->pass_manager + 0x20))->
             super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
  ;
  puVar1 = *(pointer *)((long)&(_Var4._M_head_impl)->pass_manager + 0x28);
  if ((int)((ulong)((long)puVar1 - (long)puVar2) >> 3) == 0) {
    return __return_storage_ptr__;
  }
  if (puVar1 != puVar2) {
    uVar5 = 0;
    do {
      local_40 = (char *)(**(code **)(*(long *)puVar2[uVar5]._M_t + 0x10))();
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)__return_storage_ptr__,&local_40
                );
      _Var4._M_head_impl =
           (this->impl_)._M_t.
           super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
           .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
      puVar2 = *(pointer *)
                &(((vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
                    *)((long)&(_Var4._M_head_impl)->pass_manager + 0x20))->
                 super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
                 )._M_impl;
      uVar3 = (long)*(pointer *)((long)&(_Var4._M_head_impl)->pass_manager + 0x28) - (long)puVar2;
      if ((uint)(uVar3 >> 3) <= (int)uVar5 + 1U) {
        return __return_storage_ptr__;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)uVar3 >> 3));
  }
  local_38.line = 0x93;
  local_38.column = 0;
  local_38.index = 0;
  Log(&((_Var4._M_head_impl)->pass_manager).consumer_,SPV_MSG_INTERNAL_ERROR,
      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/pass_manager.h"
      ,&local_38,"assertion failed: index out of bound");
  exit(1);
}

Assistant:

std::vector<const char*> Optimizer::GetPassNames() const {
  std::vector<const char*> v;
  for (uint32_t i = 0; i < impl_->pass_manager.NumPasses(); i++) {
    v.push_back(impl_->pass_manager.GetPass(i)->name());
  }
  return v;
}